

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Show(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  uint fAdders;
  int nCapMin;
  char *pcVar3;
  Gia_Man_t *pMan;
  Vec_Int_t *vBold;
  
  vBold = (Vec_Int_t *)0x0;
  fAdders = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"ah"), iVar1 == 0x61) {
    fAdders = fAdders ^ 1;
  }
  if (iVar1 == -1) {
    pMan = pAbc->pGia;
    if (pMan == (Gia_Man_t *)0x0) {
      pcVar3 = "Abc_CommandAbc9Show(): There is no AIG.\n";
    }
    else {
      if (pMan->nBufs == 0) {
        if ((fAdders == 0) && (pMan->vMapping != (Vec_Int_t *)0x0)) {
          p = Vec_IntAlloc(100);
          vBold = p;
          for (iVar1 = 1; pMan = pAbc->pGia, iVar1 < pMan->nObjs; iVar1 = iVar1 + 1) {
            iVar2 = Vec_IntEntry(pMan->vMapping,iVar1);
            if (iVar2 != 0) {
              iVar2 = p->nSize;
              if (iVar2 == p->nCap) {
                nCapMin = iVar2 * 2;
                if (iVar2 < 0x10) {
                  nCapMin = 0x10;
                }
                Vec_IntGrow(p,nCapMin);
                iVar2 = p->nSize;
              }
              p->nSize = iVar2 + 1;
              p->pArray[iVar2] = iVar1;
            }
          }
        }
        else {
          p = (Vec_Int_t *)0x0;
        }
        Gia_ManShow(pMan,p,fAdders);
        Vec_IntFreeP(&vBold);
        return 0;
      }
      pcVar3 = "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n";
    }
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: &show [-ah]\n");
    Abc_Print(-2,"\t        shows the current GIA using GSView\n");
    pcVar3 = "yes";
    if (fAdders == 0) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-a    : toggle visualazing adders [default = %s]\n",pcVar3);
    pcVar3 = "\t-h    : print the command usage\n";
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9Show( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Int_t * vBold = NULL;
    int c, fAdders = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAdders ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n" );
        return 1;
    }
    if ( !fAdders && Gia_ManHasMapping(pAbc->pGia) )
    {
        vBold = Vec_IntAlloc( 100 );
        Gia_ManForEachLut( pAbc->pGia, c )
            Vec_IntPush( vBold, c );
    }
    Gia_ManShow( pAbc->pGia, vBold, fAdders );
    Vec_IntFreeP( &vBold );
    return 0;

usage:
    Abc_Print( -2, "usage: &show [-ah]\n" );
    Abc_Print( -2, "\t        shows the current GIA using GSView\n" );
    Abc_Print( -2, "\t-a    : toggle visualazing adders [default = %s]\n", fAdders? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}